

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O2

void SVRG::learn(svrg *s,single_learner *base,example *ec)

{
  int iVar1;
  vw *pvVar2;
  ostream *poVar3;
  uint32_t j;
  uint index;
  float value;
  
  predict(s,base,ec);
  pvVar2 = s->all;
  iVar1 = (int)pvVar2->passes_complete;
  if (iVar1 % (s->stage_size + 1) == 0) {
    if ((s->prev_pass != iVar1) && (pvVar2->quiet == false)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"svrg pass ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      poVar3 = std::operator<<(poVar3,": committing stable point");
      std::endl<char,std::char_traits<char>>(poVar3);
      for (index = 0; index < (uint)(1L << ((byte)s->all->num_bits & 0x3f)); index = index + 1) {
        value = VW::get_weight(s->all,index,0);
        VW::set_weight(s->all,index,1,value);
        VW::set_weight(s->all,index,2,0.0);
      }
      s->stable_grad_count = 0;
      poVar3 = std::operator<<((ostream *)&std::cout,"svrg pass ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      poVar3 = std::operator<<(poVar3,": computing exact gradient");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    update_stable(s,ec);
    s->stable_grad_count = s->stable_grad_count + 1;
  }
  else {
    if ((s->prev_pass != iVar1) && (pvVar2->quiet == false)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"svrg pass ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      poVar3 = std::operator<<(poVar3,": taking steps");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    update_inner(s,ec);
  }
  s->prev_pass = iVar1;
  return;
}

Assistant:

void learn(svrg& s, single_learner& base, example& ec)
{
  assert(ec.in_use);

  predict(s, base, ec);

  const int pass = (int)s.all->passes_complete;

  if (pass % (s.stage_size + 1) == 0)  // Compute exact gradient
  {
    if (s.prev_pass != pass && !s.all->quiet)
    {
      cout << "svrg pass " << pass << ": committing stable point" << endl;
      for (uint32_t j = 0; j < VW::num_weights(*s.all); j++)
      {
        float w = VW::get_weight(*s.all, j, W_INNER);
        VW::set_weight(*s.all, j, W_STABLE, w);
        VW::set_weight(*s.all, j, W_STABLEGRAD, 0.f);
      }
      s.stable_grad_count = 0;
      cout << "svrg pass " << pass << ": computing exact gradient" << endl;
    }
    update_stable(s, ec);
    s.stable_grad_count++;
  }
  else  // Perform updates
  {
    if (s.prev_pass != pass && !s.all->quiet)
    {
      cout << "svrg pass " << pass << ": taking steps" << endl;
    }
    update_inner(s, ec);
  }

  s.prev_pass = pass;
}